

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O1

type __thiscall
robin_hood::detail::
Table<true,80ul,Rml::PropertyId,Rml::Property,robin_hood::hash<Rml::PropertyId,void>,std::equal_to<Rml::PropertyId>>
::doCreateByKey<Rml::PropertyId_const&,Rml::Property>
          (Table<true,80ul,Rml::PropertyId,Rml::Property,robin_hood::hash<Rml::PropertyId,void>,std::equal_to<Rml::PropertyId>>
           *this,PropertyId *key)

{
  char *pcVar1;
  byte *pbVar2;
  PropertyId PVar3;
  byte bVar4;
  int iVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar6;
  element_type *peVar7;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  long lVar9;
  long lVar10;
  uint uVar11;
  PropertyId *pPVar12;
  ulong uVar13;
  type unaff_R13;
  type pPVar14;
  Property local_80;
  
  do {
    PVar3 = *key;
    uVar13 = (ulong)PVar3 * -0x3f1b720669c11bf9;
    uVar11 = ((uint)(uVar13 >> 0x20) & 0x1f) >> ((byte)this[0x2c] & 0x3f);
    iVar5 = *(int *)(this + 0x28);
    uVar13 = (uVar13 << 0x20 | uVar13 >> 0x20) >> 5 & *(ulong *)(this + 0x18);
    lVar9 = *(long *)(this + 8);
    bVar4 = *(byte *)(lVar9 + uVar13);
    while (uVar11 = uVar11 + iVar5, uVar11 < bVar4) {
      pbVar2 = (byte *)(lVar9 + 1 + uVar13);
      uVar13 = uVar13 + 1;
      bVar4 = *pbVar2;
    }
    if (uVar11 == *(byte *)(lVar9 + uVar13)) {
      pPVar12 = (PropertyId *)(*(long *)this + uVar13 * 0x58);
      do {
        pPVar14 = (type)(pPVar12 + 8);
        if (PVar3 == *pPVar12) {
          bVar6 = true;
          goto LAB_0024f534;
        }
        uVar11 = uVar11 + iVar5;
        pbVar2 = (byte *)(lVar9 + 1 + uVar13);
        uVar13 = uVar13 + 1;
        pPVar12 = pPVar12 + 0x58;
      } while (uVar11 == *pbVar2);
    }
    if (*(ulong *)(this + 0x10) < *(ulong *)(this + 0x20)) {
      if (0xff < iVar5 + uVar11) {
        *(undefined8 *)(this + 0x20) = 0;
      }
      lVar10 = 1;
      do {
        lVar10 = lVar10 + -1;
        pcVar1 = (char *)(lVar9 + uVar13);
        lVar9 = lVar9 + 1;
      } while (*pcVar1 != '\0');
      pPVar12 = (PropertyId *)(*(long *)this + uVar13 * 0x58);
      if (lVar10 == 0) {
        *pPVar12 = PVar3;
        Rml::Property::Property((Property *)(pPVar12 + 8));
      }
      else {
        Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
        ::shiftUp((Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
                   *)this,uVar13 - lVar10,uVar13);
        PVar3 = *key;
        Rml::Property::Property(&local_80);
        *pPVar12 = PVar3;
        Rml::Variant::operator=((Variant *)(pPVar12 + 8),&local_80.value);
        _Var8._M_pi = local_80.source.
                      super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
        peVar7 = local_80.source.
                 super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        *(undefined8 *)(pPVar12 + 0x30) = local_80._40_8_;
        *(PropertyDefinition **)(pPVar12 + 0x38) = local_80.definition;
        *(int *)(pPVar12 + 0x40) = local_80.parser_index;
        local_80.source.super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)0x0;
        local_80.source.super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pPVar12 + 0x50);
        *(element_type **)(pPVar12 + 0x48) = peVar7;
        *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pPVar12 + 0x50) = _Var8._M_pi;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        if (local_80.source.
            super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_80.source.
                     super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        Rml::Variant::~Variant(&local_80.value);
      }
      *(char *)(*(long *)(this + 8) + uVar13) = (char)uVar11;
      *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
      bVar6 = true;
      pPVar14 = (type)(*(long *)this + uVar13 * 0x58 + 8);
    }
    else {
      Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
      ::increase_size((Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
                       *)this);
      bVar6 = false;
      pPVar14 = unaff_R13;
    }
LAB_0024f534:
    unaff_R13 = pPVar14;
    if (bVar6) {
      return pPVar14;
    }
  } while( true );
}

Assistant:

typename std::enable_if<!std::is_void<Q>::value, Q&>::type doCreateByKey(Arg&& key) {
        while (true) {
            size_t idx{};
            InfoType info{};
            keyToIdx(key, &idx, &info);
            nextWhileLess(&info, &idx);

            // while we potentially have a match. Can't do a do-while here because when mInfo is
            // 0 we don't want to skip forward
            while (info == mInfo[idx]) {
                if (WKeyEqual::operator()(key, mKeyVals[idx].getFirst())) {
                    // key already exists, do not insert.
                    return mKeyVals[idx].getSecond();
                }
                next(&info, &idx);
            }

            // unlikely that this evaluates to true
            if (ROBIN_HOOD_UNLIKELY(mNumElements >= mMaxNumElementsAllowed)) {
                increase_size();
                continue;
            }

            // key not found, so we are now exactly where we want to insert it.
            auto const insertion_idx = idx;
            auto const insertion_info = info;
            if (ROBIN_HOOD_UNLIKELY(insertion_info + mInfoInc > 0xFF)) {
                mMaxNumElementsAllowed = 0;
            }

            // find an empty spot
            while (0 != mInfo[idx]) {
                next(&info, &idx);
            }

            auto& l = mKeyVals[insertion_idx];
            if (idx == insertion_idx) {
                // put at empty spot. This forwards all arguments into the node where the object
                // is constructed exactly where it is needed.
                ::new (static_cast<void*>(&l))
                    Node(*this, std::piecewise_construct,
                         std::forward_as_tuple(std::forward<Arg>(key)), std::forward_as_tuple());
            } else {
                shiftUp(idx, insertion_idx);
                l = Node(*this, std::piecewise_construct,
                         std::forward_as_tuple(std::forward<Arg>(key)), std::forward_as_tuple());
            }

            // mKeyVals[idx].getFirst() = std::move(key);
            mInfo[insertion_idx] = static_cast<uint8_t>(insertion_info);

            ++mNumElements;
            return mKeyVals[insertion_idx].getSecond();
        }
    }